

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnEnd(TypeChecker *this,Label *label,char *sig_desc,char *end_desc)

{
  Result RVar1;
  char *end_desc_local;
  char *sig_desc_local;
  Label *label_local;
  TypeChecker *this_local;
  Result result;
  
  Result::Result((Result *)((long)&this_local + 4),Ok);
  RVar1 = PopAndCheckSignature(this,&label->result_types,sig_desc);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  RVar1 = CheckTypeStackEnd(this,end_desc);
  Result::operator|=((Result *)((long)&this_local + 4),RVar1);
  ResetTypeStackToLabel(this,label);
  PushTypes(this,&label->result_types);
  PopLabel(this);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnEnd(Label* label,
                          const char* sig_desc,
                          const char* end_desc) {
  Result result = Result::Ok;
  result |= PopAndCheckSignature(label->result_types, sig_desc);
  result |= CheckTypeStackEnd(end_desc);
  ResetTypeStackToLabel(label);
  PushTypes(label->result_types);
  PopLabel();
  return result;
}